

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3Detection::forward
          (Yolov3Detection *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  Mat *this_00;
  size_t sVar2;
  Option *pOVar3;
  long lVar4;
  int iVar5;
  pointer pMVar6;
  int *piVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  int x_offset;
  int iVar11;
  int iVar12;
  float *pfVar13;
  float *pfVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  float *pfVar18;
  Yolov3Detection *pYVar19;
  undefined4 *puVar20;
  ulong uVar21;
  long lVar22;
  float fVar23;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar28 [16];
  float fVar31;
  undefined1 auVar32 [16];
  int channels;
  vector<int,_std::allocator<int>_> mat_steps_channels;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  Mat scores;
  Mat boxes_score;
  ObjectsManager objects;
  int local_1f8;
  int local_1f4;
  Yolov3Detection *local_1f0;
  int *local_1e8;
  iterator iStack_1e0;
  int *local_1d8;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> local_1c8;
  undefined4 uStack_1b0;
  long *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  ulong local_190;
  pointer local_180;
  long local_178;
  int local_16c;
  void *local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  long *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  ulong local_130;
  float *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  long *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  ulong local_f0;
  Option *local_e0;
  long local_d8;
  ulong local_d0;
  undefined8 local_c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b8;
  long local_b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a8;
  ObjectBox local_a0;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ObjectsManager local_58;
  
  local_1f8 = ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start)->c;
  local_1e8 = (int *)0x0;
  iStack_1e0._M_current = (int *)0x0;
  local_1d8 = (int *)0x0;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_1e8,(iterator)0x0,&local_1f8);
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar11 = pMVar6->h * pMVar6->w;
  local_1f0 = this;
  local_e0 = opt;
  local_b8 = top_blobs;
  if (0x40 < (ulong)((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6)) {
    uVar21 = 1;
    lVar16 = 0;
    do {
      local_1f8 = local_1f8 + *(int *)((long)&pMVar6[1].c + lVar16);
      if (iStack_1e0._M_current == local_1d8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1e8,iStack_1e0,&local_1f8);
      }
      else {
        *iStack_1e0._M_current = local_1f8;
        iStack_1e0._M_current = iStack_1e0._M_current + 1;
      }
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = (int)((float)(*(int *)((long)&pMVar6[1].h + lVar16) *
                             *(int *)((long)&pMVar6[1].w + lVar16) + iVar11) * 0.5);
      uVar21 = uVar21 + 1;
      lVar16 = lVar16 + 0x40;
    } while (uVar21 < (ulong)((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 6));
  }
  pYVar19 = local_1f0;
  iVar5 = local_1f8 / local_1f0->box_num;
  iVar12 = -1;
  local_a8 = bottom_blobs;
  if (iVar5 == local_1f0->classes + 5) {
    ObjectsManager::ObjectsManager(&local_58,(long)((local_1f0->box_num * iVar11) / 0x14));
    if (0 < pYVar19->box_num) {
      local_b0 = (long)iVar5;
      lVar16 = 0;
      do {
        pOVar3 = local_e0;
        piVar7 = local_1e8;
        lVar17 = 0;
        lVar4 = -8;
        do {
          lVar22 = lVar4;
          lVar10 = lVar17;
          iVar11 = *piVar7;
          piVar7 = piVar7 + 1;
          lVar17 = (long)iVar11;
          lVar4 = lVar22 + 0x40;
        } while ((long)iVar11 <= lVar16 * local_b0);
        pMVar6 = (local_a8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = (int)(lVar16 * local_b0) - (int)lVar10;
        iVar11 = *(int *)((long)&pMVar6->c + lVar22);
        local_190 = *(ulong *)((long)&pMVar6->elempack + lVar22);
        local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)iVar5 * *(long *)((long)&pMVar6[1].data + lVar22) * local_190 +
                      *(long *)((long)&pMVar6->refcount + lVar22));
        iVar12 = *(int *)((long)&pMVar6->cstep + lVar22);
        uStack_1b0 = *(undefined4 *)((long)&pMVar6->allocator + lVar22);
        local_1a8 = *(long **)((long)&pMVar6->dims + lVar22);
        local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)local_190;
        local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(local_190 >> 0x20);
        local_1a0 = CONCAT44(iVar11,3);
        uStack_198 = CONCAT44(2,iVar12);
        local_190 = ((long)(iVar12 * iVar11) * local_190 + 0xf & 0xfffffffffffffff0) / local_190;
        (*pYVar19->sigmoid->_vptr_Layer[9])(pYVar19->sigmoid,&local_1c8,local_e0);
        iVar11 = *(int *)((long)&pMVar6->c + lVar22);
        local_f0 = *(ulong *)((long)&pMVar6->elempack + lVar22);
        local_128 = (float *)((long)(iVar5 + 4) * *(long *)((long)&pMVar6[1].data + lVar22) *
                              local_f0 + *(long *)((long)&pMVar6->refcount + lVar22));
        iVar12 = *(int *)((long)&pMVar6->cstep + lVar22);
        uStack_110 = *(undefined4 *)((long)&pMVar6->allocator + lVar22);
        local_108 = *(long **)((long)&pMVar6->dims + lVar22);
        uStack_120 = 0;
        uStack_11c = 0;
        uStack_118 = (undefined4)local_f0;
        uStack_114 = (undefined4)(local_f0 >> 0x20);
        local_100 = CONCAT44(iVar11,3);
        uStack_f8 = CONCAT44(1,iVar12);
        local_f0 = ((long)(iVar12 * iVar11) * local_f0 + 0xf & 0xfffffffffffffff0) / local_f0;
        local_d8 = lVar16;
        (*pYVar19->sigmoid->_vptr_Layer[9])(pYVar19->sigmoid,&local_128,pOVar3);
        pfVar9 = local_128;
        lVar16 = *(long *)((long)&pMVar6[1].data + lVar22);
        local_178 = *(long *)((long)&pMVar6->refcount + lVar22);
        local_c8 = *(long *)((long)&pMVar6->elempack + lVar22);
        iVar11 = *(int *)((long)&pMVar6->c + lVar22);
        iVar12 = *(int *)((long)&pMVar6->cstep + lVar22);
        local_130 = *(ulong *)((long)&pMVar6->elempack + lVar22);
        local_168 = (void *)((long)(iVar5 + 5) * *(long *)((long)&pMVar6[1].data + lVar22) *
                             local_130 + *(long *)((long)&pMVar6->refcount + lVar22));
        uStack_150 = *(undefined4 *)((long)&pMVar6->allocator + lVar22);
        local_148 = *(long **)((long)&pMVar6->dims + lVar22);
        uStack_160 = 0;
        uStack_15c = 0;
        uStack_158 = (undefined4)local_130;
        uStack_154 = (undefined4)(local_130 >> 0x20);
        local_180 = local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        lVar17 = CONCAT44(local_1c8.
                          super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          local_1c8.
                          super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) * local_190;
        local_140 = CONCAT44(iVar11,3);
        uStack_138 = CONCAT44(pYVar19->classes,iVar12);
        local_130 = ((long)(iVar12 * iVar11) * local_130 + 0xf & 0xfffffffffffffff0) / local_130;
        (*(&pYVar19->softmax)[pYVar19->softmax_enable == 0]->_vptr_Layer[9])
                  ((&pYVar19->softmax)[pYVar19->softmax_enable == 0],&local_168,pOVar3);
        uVar21 = *(ulong *)((long)&pMVar6->c + lVar22);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar21;
        local_16c = (int)(uVar21 >> 0x20);
        if (0 < local_16c) {
          pfVar18 = (float *)((long)&local_180->xmin + lVar17);
          puVar20 = (undefined4 *)((iVar5 + 2) * lVar16 * local_c8 + local_178);
          pfVar13 = (float *)((iVar5 + 3) * lVar16 * local_c8 + local_178);
          uVar8._0_4_ = local_1f0->net_width;
          uVar8._4_4_ = local_1f0->net_height;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar8;
          auVar28._0_4_ = -(uint)((undefined4)uVar8 == 0);
          iVar11 = -(uint)(uVar8._4_4_ == 0);
          auVar32._4_4_ = iVar11;
          auVar32._0_4_ = iVar11;
          auVar32._8_4_ = iVar11;
          auVar32._12_4_ = iVar11;
          auVar28._4_4_ = auVar28._0_4_;
          auVar28._8_4_ = auVar28._0_4_;
          auVar28._12_4_ = iVar11;
          auVar24 = ~(auVar28 | auVar32) & auVar26 | auVar24 & (auVar28 | auVar32);
          auVar27._0_4_ = (float)auVar24._0_4_;
          auVar27._4_4_ = (float)auVar24._4_4_;
          auVar27._8_4_ = (float)auVar24._8_4_;
          auVar27._12_4_ = (float)auVar24._12_4_;
          auVar24 = rcpps(auVar24,auVar27);
          fVar23 = auVar24._0_4_;
          fVar29 = auVar24._4_4_;
          fVar30 = auVar24._8_4_;
          fVar31 = auVar24._12_4_;
          uVar1 = *(undefined8 *)((long)(local_1f0->biases).data + local_d8 * 8);
          local_68._0_4_ = (float)uVar1 * ((1.0 - auVar27._0_4_ * fVar23) * fVar23 + fVar23);
          local_68._4_4_ =
               (float)((ulong)uVar1 >> 0x20) * ((1.0 - auVar27._4_4_ * fVar29) * fVar29 + fVar29);
          local_68._8_4_ = ((0.0 - auVar27._8_4_ * fVar30) * fVar30 + fVar30) * 0.0;
          local_68._12_4_ = ((0.0 - auVar27._12_4_ * fVar31) * fVar31 + fVar31) * 0.0;
          local_d0 = uVar21 & 0xffffffff;
          auVar25._0_4_ = (float)(int)uVar21;
          auVar25._4_4_ = (float)local_16c;
          auVar25._8_8_ = 0;
          auVar24 = rcpps(local_68,auVar25);
          local_88 = auVar24._0_4_;
          fStack_84 = auVar24._4_4_;
          fStack_80 = auVar24._8_4_;
          fStack_7c = auVar24._12_4_;
          local_88 = (1.0 - auVar25._0_4_ * local_88) * local_88 + local_88;
          fStack_84 = (1.0 - auVar25._4_4_ * fStack_84) * fStack_84 + fStack_84;
          fStack_80 = (0.0 - fStack_80 * 0.0) * fStack_80 + fStack_80;
          fStack_7c = (0.0 - fStack_7c * 0.0) * fStack_7c + fStack_7c;
          local_1f4 = 0;
          do {
            if (0 < (int)local_d0) {
              local_78 = ZEXT416((uint)(float)local_1f4);
              lVar16 = 0;
              uVar21 = 0;
              do {
                local_178 = CONCAT44(local_178._4_4_,*puVar20);
                fVar23 = expf(*pfVar13);
                local_c8 = CONCAT44(extraout_XMM0_Db,fVar23);
                fVar23 = expf((float)local_178);
                if ((long)local_1f0->classes < 1) {
                  iVar11 = 0;
                  fVar29 = 0.0;
                }
                else {
                  pfVar14 = (float *)((long)local_1f4 * (long)local_140._4_4_ *
                                      CONCAT44(uStack_154,uStack_158) + lVar16 + (long)local_168);
                  uVar15 = 0;
                  uVar8 = 0;
                  fVar30 = 0.0;
                  do {
                    fVar29 = *pfVar14;
                    if (fVar30 < fVar29) {
                      uVar8 = uVar15 & 0xffffffff;
                    }
                    iVar11 = (int)uVar8;
                    if (fVar29 <= fVar30) {
                      fVar29 = fVar30;
                    }
                    uVar15 = uVar15 + 1;
                    pfVar14 = (float *)((long)pfVar14 + CONCAT44(uStack_154,uStack_158) * local_130)
                    ;
                    fVar30 = fVar29;
                  } while ((long)local_1f0->classes != uVar15);
                }
                if (local_1f0->confidence_threshold <= fVar29 * *pfVar9) {
                  local_a0.xmin =
                       (local_180->xmin + (float)(int)uVar21) * local_88 +
                       fVar23 * (float)local_68._0_4_ * -0.5;
                  local_a0.ymin =
                       (*pfVar18 + (float)local_78._0_4_) * fStack_84 +
                       (float)local_c8 * (float)local_68._4_4_ * -0.5;
                  local_a0.xmax = fVar23 * (float)local_68._0_4_ + local_a0.xmin;
                  local_a0.ymax = (float)local_c8 * (float)local_68._4_4_ + local_a0.ymin;
                  local_a0.prob = fVar29 * *pfVar9;
                  local_a0.classid = iVar11;
                  ObjectsManager::add_new_object_box(&local_58,&local_a0);
                }
                local_180 = (pointer)&local_180->ymin;
                pfVar18 = pfVar18 + 1;
                puVar20 = puVar20 + 1;
                pfVar13 = pfVar13 + 1;
                pfVar9 = pfVar9 + 1;
                uVar21 = uVar21 + 1;
                lVar16 = lVar16 + 4;
              } while (uVar21 != local_d0);
            }
            local_1f4 = local_1f4 + 1;
          } while (local_1f4 != local_16c);
        }
        lVar16 = local_d8;
        pYVar19 = local_1f0;
        piVar7 = (int *)CONCAT44(uStack_15c,uStack_160);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_148 == (long *)0x0) {
              if (local_168 != (void *)0x0) {
                free(local_168);
              }
            }
            else {
              (**(code **)(*local_148 + 0x18))();
            }
          }
        }
        uStack_158 = 0;
        uStack_154 = 0;
        uStack_150 = 0;
        local_168 = (void *)0x0;
        uStack_160 = 0;
        uStack_15c = 0;
        local_140 = 0;
        uStack_138 = 0;
        local_130 = 0;
        piVar7 = (int *)CONCAT44(uStack_11c,uStack_120);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_108 == (long *)0x0) {
              if (local_128 != (float *)0x0) {
                free(local_128);
              }
            }
            else {
              (**(code **)(*local_108 + 0x18))();
            }
          }
        }
        uStack_118 = 0;
        uStack_114 = 0;
        uStack_110 = 0;
        local_128 = (float *)0x0;
        uStack_120 = 0;
        uStack_11c = 0;
        local_100 = 0;
        uStack_f8 = 0;
        local_f0 = 0;
        piVar7 = (int *)CONCAT44(local_1c8.
                                 super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_1c8.
                                 super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_1a8 == (long *)0x0) {
              if (local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                     ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (**(code **)(*local_1a8 + 0x18))();
            }
          }
        }
        uStack_1b0 = 0;
        local_1a0 = 0;
        uStack_198 = 0;
        local_190 = 0;
        lVar16 = lVar16 + 1;
      } while (lVar16 < pYVar19->box_num);
    }
    local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    ObjectsManager::do_objects_nms
              (&local_58,&local_1c8,pYVar19->nms_threshold,pYVar19->confidence_threshold);
    this_00 = (local_b8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,6,
                (int)((ulong)(CONCAT44(local_1c8.
                                       super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       local_1c8.
                                       super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                             (long)local_1c8.
                                   super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,4,
                local_e0->blob_allocator);
    iVar12 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      lVar16 = CONCAT44(local_1c8.
                        super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        local_1c8.
                        super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_4_) -
               (long)local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      iVar12 = 0;
      if (lVar16 != 0) {
        lVar16 = (lVar16 >> 3) * -0x5555555555555555;
        iVar11 = this_00->w;
        lVar16 = lVar16 + (ulong)(lVar16 == 0);
        sVar2 = this_00->elemsize;
        pfVar9 = (float *)((long)this_00->data + 0x14);
        piVar7 = &(local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                   _M_impl.super__Vector_impl_data._M_start)->classid;
        do {
          pfVar9[-5] = (float)(*piVar7 + 1);
          pfVar9[-4] = (float)piVar7[-1];
          pfVar9[-3] = ((ObjectBox *)(piVar7 + -5))->xmin;
          pfVar9[-2] = (float)piVar7[-4];
          pfVar9[-1] = (float)piVar7[-3];
          *pfVar9 = (float)piVar7[-2];
          pfVar9 = (float *)((long)pfVar9 + (long)iVar11 * sVar2);
          piVar7 = piVar7 + 6;
          lVar16 = lVar16 + -1;
          iVar12 = 0;
        } while (lVar16 != 0);
      }
    }
    if (local_1c8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.
                      super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT44(local_1c8.
                               super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_1c8.
                               super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                      (long)local_1c8.
                            super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ObjectsManager::~ObjectsManager(&local_58);
  }
  if (local_1e8 != (int *)0x0) {
    operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  return iVar12;
}

Assistant:

int Yolov3Detection::forward(const std::vector<Mat> &bottom_blobs, std::vector<Mat> &top_blobs, const Option &opt) const
{
    int channels = bottom_blobs[0].c;
    std::vector<int> mat_steps_channels;
    mat_steps_channels.push_back(channels);
    int prob_steps = bottom_blobs[0].w * bottom_blobs[0].h;
    for (int b = 1; b < bottom_blobs.size(); b++)
    {
        channels += bottom_blobs[b].c;
        mat_steps_channels.push_back(channels);
        prob_steps += bottom_blobs[b].w * bottom_blobs[b].h;
        prob_steps *= 0.5f;
    }

    const int channels_per_box = channels / box_num;

    // anchor coord + box score + num_class
    if (channels_per_box != 4 + 1 + classes)
        return -1;
        
    ObjectsManager objects(prob_steps * box_num / 20);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < box_num; pp++)
    {
        int p = pp * channels_per_box;

        int current_mat_index = 0;
        int front_mat_channels = 0;
        while (p >= mat_steps_channels[current_mat_index])
        {
            front_mat_channels = mat_steps_channels[current_mat_index];
            current_mat_index++;
        }

        const Mat &bottom_blob = bottom_blobs[current_mat_index];
        p -= front_mat_channels;

        Mat locations = bottom_blob.channel_range(p, 2);
        sigmoid->forward_inplace(locations, opt);
        Mat boxes_score = bottom_blob.channel_range(p + 4, 1);
        sigmoid->forward_inplace(boxes_score, opt); 

        const float *xptr = locations.channel(0);
        const float *yptr = locations.channel(1);
        const float *wptr = bottom_blob.channel(p + 2);
        const float *hptr = bottom_blob.channel(p + 3);

        const float *box_score_ptr = boxes_score.channel(0);

        Mat scores = bottom_blob.channel_range(p + 5, classes);
        if (softmax_enable)
        {
            // softmax class scores
            softmax->forward_inplace(scores, opt);
        }
        else
        {
            // Not use softmax to avoid class competition
            sigmoid->forward_inplace(scores, opt);
        }

        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int real_w = w, real_h = h;
        if (net_height != 0 && net_width != 0)
        {
            real_w = net_width;
            real_h = net_height;
        }

        const float bias_w = biases[pp * 2] / real_w;
        const float bias_h = biases[pp * 2 + 1] / real_h;

        for (int y_offset = 0; y_offset < h; y_offset++)
        {
            for (int x_offset = 0; x_offset < w; x_offset++)
            {

                float box_w = exp(wptr[0]) * bias_w;
                float box_h = exp(hptr[0]) * bias_h;

                float xmin = (xptr[0] + x_offset) / w - box_w * 0.5f;
                float ymin = (yptr[0] + y_offset) / h - box_h * 0.5f;
                float xmax = xmin + box_w;
                float ymax = ymin + box_h;

                // box score
                float box_score = box_score_ptr[0];

                // find class index with max class score
                int class_index = 0;
                float class_score = 0.f;
                for (int q = 0; q < classes; q ++)
                {
                    float score = scores.channel(q).row(y_offset)[x_offset];

                    if (score > class_score)
                    {
                        class_index = q;
                        class_score = score;
                    }
                }

                float prob = box_score * class_score;
                if (prob >= confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = class_index,
                    };
                    objects.add_new_object_box(object);
                }

                xptr++;
                yptr++;
                wptr++;
                hptr++;

                box_score_ptr++;
            }
        }
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    Mat &top_blob = top_blobs[0];
    top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);

    if (top_blob.empty())
        return -100;

    for (int i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}